

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bs.h
# Opt level: O2

uint32_t BS::weight_gen(vw *all)

{
  uint32_t uVar1;
  float fVar2;
  
  fVar2 = merand48(&all->random_state);
  uVar1 = 0;
  if (0.36787945 < fVar2) {
    if (fVar2 <= 0.7357589) {
      uVar1 = 1;
    }
    else if (fVar2 <= 0.9196986) {
      uVar1 = 2;
    }
    else if (fVar2 <= 0.98101187) {
      uVar1 = 3;
    }
    else if (fVar2 <= 0.99634016) {
      uVar1 = 4;
    }
    else if (fVar2 <= 0.9994058) {
      uVar1 = 5;
    }
    else if (fVar2 <= 0.99991673) {
      uVar1 = 6;
    }
    else if (fVar2 <= 0.99998975) {
      uVar1 = 7;
    }
    else if (fVar2 <= 0.99999887) {
      uVar1 = 8;
    }
    else if (fVar2 <= 0.9999999) {
      uVar1 = 9;
    }
    else if (fVar2 <= 1.0) {
      uVar1 = 10;
    }
    else if (fVar2 <= 1.0) {
      uVar1 = 0xb;
    }
    else if (fVar2 <= 1.0) {
      uVar1 = 0xc;
    }
    else if (fVar2 <= 1.0) {
      uVar1 = 0xd;
    }
    else if (fVar2 <= 1.0) {
      uVar1 = 0xe;
    }
    else if (fVar2 <= 1.0) {
      uVar1 = 0xf;
    }
    else if (fVar2 <= 1.0) {
      uVar1 = 0x10;
    }
    else if (fVar2 <= 1.0) {
      uVar1 = 0x11;
    }
    else if (fVar2 <= 1.0) {
      uVar1 = 0x12;
    }
    else {
      uVar1 = 0x14;
    }
  }
  return uVar1;
}

Assistant:

inline uint32_t weight_gen(vw& all)  // sampling from Poisson with rate 1
{
  float temp = merand48(all.random_state);
  if (temp <= 0.3678794411714423215955)
    return 0;
  if (temp <= 0.735758882342884643191)
    return 1;
  if (temp <= 0.919698602928605803989)
    return 2;
  if (temp <= 0.9810118431238461909214)
    return 3;
  if (temp <= 0.9963401531726562876545)
    return 4;
  if (temp <= 0.9994058151824183070012)
    return 5;
  if (temp <= 0.9999167588507119768923)
    return 6;
  if (temp <= 0.9999897508033253583053)
    return 7;
  if (temp <= 0.9999988747974020309819)
    return 8;
  if (temp <= 0.9999998885745216612793)
    return 9;
  if (temp <= 0.9999999899522336243091)
    return 10;
  if (temp <= 0.9999999991683892573118)
    return 11;
  if (temp <= 0.9999999999364022267287)
    return 12;
  if (temp <= 0.999999999995480147453)
    return 13;
  if (temp <= 0.9999999999996999989333)
    return 14;
  if (temp <= 0.9999999999999813223654)
    return 15;
  if (temp <= 0.9999999999999989050799)
    return 16;
  if (temp <= 0.9999999999999999393572)
    return 17;
  if (temp <= 0.999999999999999996817)
    return 18;
  if (temp <= 0.9999999999999999998412)
    return 19;
  return 20;
}